

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSource.h
# Opt level: O0

bool __thiscall COLLADASaxFWL::SourceBase::isLoadedInputElement(SourceBase *this,Semantic *semantic)

{
  size_t sVar1;
  Semantic *pSVar2;
  Semantic *in_RSI;
  long in_RDI;
  Semantic *currentSemantic;
  size_t i;
  size_t numLoadedInputElements;
  size_t local_28;
  
  sVar1 = COLLADAFW::ArrayPrimitiveType<COLLADASaxFWL::InputSemantic::Semantic>::getCount
                    ((ArrayPrimitiveType<COLLADASaxFWL::InputSemantic::Semantic> *)(in_RDI + 0x38));
  local_28 = 0;
  while( true ) {
    if (sVar1 <= local_28) {
      return false;
    }
    pSVar2 = COLLADAFW::ArrayPrimitiveType<COLLADASaxFWL::InputSemantic::Semantic>::operator[]
                       ((ArrayPrimitiveType<COLLADASaxFWL::InputSemantic::Semantic> *)
                        (in_RDI + 0x38),local_28);
    if (*pSVar2 == *in_RSI) break;
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

bool isLoadedInputElement ( const InputSemantic::Semantic& semantic )
        {
            const size_t numLoadedInputElements = mLoadedInputElements.getCount ();
            for ( size_t i=0; i<numLoadedInputElements; ++i )
            {
                InputSemantic::Semantic& currentSemantic = mLoadedInputElements [i];
                if ( currentSemantic == semantic ) return true;
            }

            return false;
        }